

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recalc.cpp
# Opt level: O2

void __thiscall Simplex::printTableau(Simplex *this,bool full)

{
  IndexVal **ppIVar1;
  int *piVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  long lVar8;
  ulong uVar9;
  int i_3;
  int iVar10;
  ulong uVar11;
  long lVar12;
  int i;
  ulong uVar13;
  int i_2;
  ulong uVar14;
  int j;
  longdouble lVar15;
  
  calcRHS(this);
  lVar8 = (long)this->m + (long)this->n;
  uVar13 = lVar8 * 0x10;
  if ((int)lVar8 < 0) {
    uVar13 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar13);
  fwrite("Tableau:\n",9,1,_stderr);
  for (uVar13 = 0; (long)uVar13 < (long)this->m + (long)this->n; uVar13 = uVar13 + 1) {
    fprintf(_stderr,"%d:%d ",uVar13 & 0xffffffff,(ulong)(uint)this->shift[uVar13]);
  }
  fputc(10,_stderr);
  for (lVar8 = 0; lVar8 < this->m; lVar8 = lVar8 + 1) {
    calcBInvRow(this,(longdouble *)((long)this->n * 0x10 + (long)pvVar5),(int)lVar8);
    uVar4 = this->n;
    ppIVar1 = this->AV;
    piVar2 = this->AV_nz;
    uVar13 = 0;
    if (0 < (int)uVar4) {
      uVar13 = (ulong)uVar4;
    }
    for (uVar11 = 0; uVar11 != uVar13; uVar11 = uVar11 + 1) {
      *(longdouble *)((long)pvVar5 + uVar11 * 0x10) = (longdouble)0;
      uVar3 = piVar2[uVar11];
      if (piVar2[uVar11] < 1) {
        uVar3 = 0;
      }
      lVar15 = (longdouble)0;
      for (lVar12 = 0; (ulong)uVar3 * 0x10 != lVar12; lVar12 = lVar12 + 0x10) {
        lVar15 = *(longdouble *)((long)&ppIVar1[uVar11]->field_0 + lVar12) *
                 *(longdouble *)
                  ((long)pvVar5 +
                  ((long)*(int *)((long)&ppIVar1[uVar11]->field_0 + lVar12 + 0xc) + (long)(int)uVar4
                  ) * 0x10) + lVar15;
        *(longdouble *)(uVar11 * 0x10 + (long)pvVar5) = lVar15;
      }
    }
    fprintf(_stderr,"%d: ",(ulong)(uint)this->rtoc[lVar8]);
    if (full) {
      for (uVar13 = 0; (long)uVar13 < (long)this->m + (long)this->n; uVar13 = uVar13 + 1) {
        fprintf(_stderr,"%d:%.3Lf ",uVar13 & 0xffffffff);
      }
    }
    fprintf(_stderr,"rhs:%.18Lf");
    fputc(10,_stderr);
  }
  printObjective(this);
  fflush(_stderr);
  iVar10 = this->n;
  uVar11 = (ulong)this->m;
  uVar4 = iVar10 + this->m;
  uVar14 = 0;
  uVar13 = (long)(int)uVar4 * 8;
  if ((int)uVar4 < 0) {
    uVar13 = 0xffffffffffffffff;
  }
  uVar9 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar9 = uVar14;
  }
  pvVar6 = operator_new__(uVar13);
  uVar13 = uVar11 << 4;
  if ((long)uVar11 < 0) {
    uVar13 = 0xffffffffffffffff;
  }
  for (; uVar9 != uVar14; uVar14 = uVar14 + 1) {
    pvVar7 = operator_new__(uVar13);
    *(void **)((long)pvVar6 + uVar14 * 8) = pvVar7;
  }
  lVar8 = 0;
  while( true ) {
    if (iVar10 + (int)uVar11 <= lVar8) break;
    uVar13 = uVar11 & 0xffffffff;
    if ((int)uVar11 < 1) {
      uVar13 = 0;
    }
    for (lVar12 = 0; uVar13 * 0x10 != lVar12; lVar12 = lVar12 + 0x10) {
      *(longdouble *)(*(long *)((long)pvVar6 + lVar8 * 8) + lVar12) = (longdouble)0;
    }
    ppIVar1 = this->AV;
    uVar13 = (ulong)(uint)this->AV_nz[lVar8];
    if (this->AV_nz[lVar8] < 1) {
      uVar13 = 0;
    }
    for (lVar12 = 0; uVar13 * 0x10 != lVar12; lVar12 = lVar12 + 0x10) {
      *(unkbyte10 *)
       (*(long *)((long)pvVar6 + lVar8 * 8) +
       (long)*(int *)((long)&ppIVar1[lVar8]->field_0 + lVar12 + 0xc) * 0x10) =
           *(unkbyte10 *)((long)&ppIVar1[lVar8]->field_0 + lVar12);
    }
    Bmultiply(this,*(longdouble **)((long)pvVar6 + lVar8 * 8));
    lVar8 = lVar8 + 1;
    iVar10 = this->n;
    uVar11 = (ulong)(uint)this->m;
  }
  for (lVar8 = 0; lVar8 < (int)uVar11; lVar8 = lVar8 + 1) {
    fprintf(_stderr,"%d: ",(ulong)(uint)this->rtoc[lVar8]);
    uVar13 = 0;
    while( true ) {
      if ((long)this->m + (long)this->n <= (long)uVar13) break;
      fprintf(_stderr,"%d:%.3Lf ",uVar13 & 0xffffffff);
      uVar13 = uVar13 + 1;
    }
    fputc(10,_stderr);
    uVar11 = (ulong)(uint)this->m;
  }
  operator_delete__(pvVar5);
  for (lVar8 = 0; lVar8 < (long)this->m + (long)this->n; lVar8 = lVar8 + 1) {
    operator_delete(*(void **)((long)pvVar6 + lVar8 * 8));
  }
  operator_delete__(pvVar6);
  return;
}

Assistant:

void Simplex::printTableau(bool full) {
	calcRHS();
	//	long double row[n+m];
	auto* row = new long double[n + m];
	fprintf(stderr, "Tableau:\n");
	for (int i = 0; i < n + m; i++) {
		fprintf(stderr, "%d:%d ", i, shift[i]);
	}
	fprintf(stderr, "\n");
	for (int i = 0; i < m; i++) {
		calcBInvRow(&row[n], i);
		for (int j = 0; j < n; j++) {
			row[j] = 0;
			for (int k = 0; k < AV_nz[j]; k++) {
				row[j] += row[n + AV[j][k].index()] * AV[j][k].val();
			}
		}
		fprintf(stderr, "%d: ", rtoc[i]);
		if (full) {
			for (int j = 0; j < n + m; j++) {
				fprintf(stderr, "%d:%.3Lf ", j, row[j]);
			}
		}
		fprintf(stderr, "rhs:%.18Lf", rhs[i]);
		fprintf(stderr, "\n");
		//		row[rtoc[i]] -= 1;
		//		for (int j = 0; j < m; j++) {
		//			if (!almostZero6(row[rtoc[j]])) fprintf(stderr, "%d:%d:%.2Lf ", i, j, row[rtoc[j]]);
		//			assert(almostZero6(row[rtoc[j]]));
		//		}
	}
	printObjective();
	fflush(stderr);

	//	long double T[n+m][m];
	auto** T = new long double*[n + m];
	for (int i = 0; i < n + m; i++) {
		T[i] = new long double[m];
	}
	for (int i = 0; i < n + m; i++) {
		for (int j = 0; j < m; j++) {
			T[i][j] = 0;
		}
		for (int j = 0; j < AV_nz[i]; j++) {
			T[i][AV[i][j].index()] = AV[i][j].val();
		}
		Bmultiply(T[i]);
	}

	for (int i = 0; i < m; i++) {
		fprintf(stderr, "%d: ", rtoc[i]);
		for (int j = 0; j < n + m; j++) {
			fprintf(stderr, "%d:%.3Lf ", j, T[j][i]);
		}
		fprintf(stderr, "\n");
	}

	delete[] row;
	for (int i = 0; i < n + m; i++) {
		delete T[i];
	}
	delete[] T;
}